

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Reg5U
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,RegSlot R4,
          uint slotIndex)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot R2_00;
  RegSlot R3_00;
  RegSlot R4_00;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x9);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x23a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cb08b;
    *puVar3 = 0;
  }
  R0_00 = ConsumeReg(this,R0);
  R1_00 = ConsumeReg(this,R1);
  R2_00 = ConsumeReg(this,R2);
  R3_00 = ConsumeReg(this,R3);
  R4_00 = ConsumeReg(this,R4);
  bVar2 = TryWriteReg5U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,R0_00,R1_00,R2_00,R3_00,R4_00,slotIndex);
  if (!bVar2) {
    bVar2 = TryWriteReg5U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,R0_00,R1_00,R2_00,R3_00,R4_00,slotIndex);
    if (!bVar2) {
      bVar2 = TryWriteReg5U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op,R0_00,R1_00,R2_00,R3_00,R4_00,slotIndex);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x242,"(success)","success");
        if (!bVar2) {
LAB_007cb08b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg5U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, uint slotIndex)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg5U);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);
        R3 = ConsumeReg(R3);
        R4 = ConsumeReg(R4);

        MULTISIZE_LAYOUT_WRITE(Reg5U, op, R0, R1, R2, R3, R4, slotIndex);
    }